

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>::
TPZFrontMatrix(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontSym<long_double>_>
               *this,void **vtt,int64_t globalsize)

{
  void *in_RDX;
  TPZFrontSym<long_double> *in_RSI;
  void **in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  void **GlobalSize;
  TPZAbstractFrontMatrix<long_double> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZAbstractFrontMatrix<long_double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffd0,in_RDI,(int64_t)in_RSI,in_stack_ffffffffffffffb8);
  *in_RDI = (in_RSI->super_TPZFront<long_double>).super_TPZSavable._vptr_TPZSavable;
  TPZStackEqnStorage<long_double>::TPZStackEqnStorage
            ((TPZStackEqnStorage<long_double> *)(in_RDI + 4));
  GlobalSize = in_RDI + 0x6662;
  TPZFrontSym<long_double>::TPZFrontSym(in_RSI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x6689));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x668d));
  TPZFrontSym<long_double>::Reset(in_RSI,(int64_t)GlobalSize);
  TPZStackEqnStorage<long_double>::Reset((TPZStackEqnStorage<long_double> *)0x1ce3e45);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x6688] = (void *)0xffffffffffffffff;
  in_RDI[0x6687] = in_RDX;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix(int64_t globalsize) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>(globalsize,globalsize)
{
	fFront.Reset(globalsize);
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=globalsize;
}